

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::AssertionResult::getExpressionInMacro_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  size_type sVar1;
  char *pcVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = (this->m_info).macroName.m_size;
  if (sVar1 == 0) {
    pcVar2 = (this->m_info).capturedExpression.m_start;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,pcVar2,pcVar2 + (this->m_info).capturedExpression.m_size);
    getExpressionInMacro_abi_cxx11_();
  }
  else {
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (__return_storage_ptr__,sVar1 + (this->m_info).capturedExpression.m_size + 4);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,(this->m_info).macroName.m_start,
               (this->m_info).macroName.m_size);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"( ");
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,(this->m_info).capturedExpression.m_start,
               (this->m_info).capturedExpression.m_size);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__," )");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpressionInMacro() const {
    std::string expr;
    if (m_info.macroName.empty())
      expr = static_cast<std::string>(m_info.capturedExpression);
    else {
      expr.reserve(m_info.macroName.size() + m_info.capturedExpression.size() + 4);
      expr += m_info.macroName;
      expr += "( ";
      expr += m_info.capturedExpression;
      expr += " )";
    }
    return expr;
  }